

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_reporter.c
# Opt level: O1

void show_breadcrumb(char *name,void *memo_ptr)

{
  if (1 < *(int *)((long)memo_ptr + 0x10)) {
    (**memo_ptr)("-> ");
  }
  if (0 < *(int *)((long)memo_ptr + 0x10)) {
    (**memo_ptr)("%s ",name);
  }
  *(int *)((long)memo_ptr + 0x10) = *(int *)((long)memo_ptr + 0x10) + 1;
  return;
}

Assistant:

static void show_breadcrumb(const char *name, void *memo_ptr) {
    TextMemo *memo = (TextMemo *)memo_ptr;
    if (memo->depth > 1) {
        memo->printer("-> ");
    }
    if (memo->depth > 0) {
        memo->printer("%s ", name);
    }
    memo->depth++;
}